

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O1

void mi_page_free_list_extend(mi_page_t *page,size_t bsize,size_t extend,mi_stats_t *stats)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  mi_block_t *pmVar4;
  long lVar5;
  long lVar6;
  
  puVar1 = page->page_start;
  uVar3 = (ulong)page->capacity;
  lVar5 = uVar3 * bsize;
  lVar6 = (extend + uVar3 + -1) * bsize;
  if (lVar5 - lVar6 == 0 || lVar5 < lVar6) {
    puVar2 = puVar1 + (uVar3 + 1) * bsize;
    pmVar4 = (mi_block_t *)(puVar1 + lVar5);
    do {
      pmVar4->next = (mi_encoded_t)puVar2;
      pmVar4 = (mi_block_t *)((long)&pmVar4->next + bsize);
      puVar2 = puVar2 + bsize;
    } while (pmVar4 <= (mi_block_t *)(puVar1 + lVar6));
  }
  ((mi_block_t *)(puVar1 + lVar6))->next = (mi_encoded_t)page->free;
  page->free = (mi_block_t *)(puVar1 + lVar5);
  return;
}

Assistant:

static inline uint8_t* mi_page_start(const mi_page_t* page) {
  mi_assert_internal(page->page_start != NULL);
  mi_assert_expensive(_mi_segment_page_start(_mi_page_segment(page),page,NULL) == page->page_start);
  return page->page_start;
}